

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

bool absl::lts_20240722::str_format_internal::ConvertIntArg<absl::lts_20240722::uint128>
               (uint128 v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  wchar_t v_00;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  FormatConversionSpecImpl conv_00;
  string_view v_01;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  IntDigits as_digits;
  FormatConversionSpecImpl local_78;
  undefined1 local_68 [64];
  double local_28;
  double dStack_20;
  
  uVar4 = conv.precision_;
  local_78._0_8_ = conv._0_8_;
  uVar6 = v.hi_;
  uVar7 = v.lo_;
  v_00 = conv._0_4_;
  local_78.precision_ = uVar4;
  switch(local_78._0_8_ & 0xff) {
  case 0:
    conv_00.precision_ = (int)sink;
    if ((v_00 & 0xff0000U) != 0x20000) {
      conv_02.precision_ = conv_00.precision_;
      conv_02.conv_ = (char)local_78._0_8_;
      conv_02.flags_ = (char)((ulong)local_78._0_8_ >> 8);
      conv_02.length_mod_ = (char)((ulong)local_78._0_8_ >> 0x10);
      conv_02._3_1_ = (char)((ulong)local_78._0_8_ >> 0x18);
      conv_02.width_ = (int)((ulong)local_78._0_8_ >> 0x20);
      anon_unknown_53::ConvertCharImpl
                ((char)v.lo_,conv_02,(FormatSinkImpl *)&switchD_0010a282::switchdataD_00110400);
      return true;
    }
    conv_00.width_ = 0;
    conv_00.conv_ = (char)uVar4;
    conv_00.flags_ = (char)(uVar4 >> 8);
    conv_00.length_mod_ = (char)(uVar4 >> 0x10);
    conv_00._3_1_ = (char)(uVar4 >> 0x18);
    bVar2 = anon_unknown_53::ConvertWCharTImpl
                      ((anon_unknown_53 *)(uVar7 & 0xffffffff),v_00,conv_00,sink);
    return bVar2;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = absl::uint128]"
                 );
  case 2:
  case 3:
  case 5:
  case 0x12:
    anon_unknown_53::IntDigits::PrintAsDec((IntDigits *)local_68,v,false);
    goto LAB_0010a3aa;
  case 4:
    lVar3 = 0;
    do {
      do {
        bVar1 = (byte)uVar7;
        uVar7 = uVar7 >> 3 | uVar6 << 0x3d;
        local_68[lVar3 + 0x3b] = bVar1 & 7 | 0x30;
        uVar5 = uVar6 >> 3;
        lVar3 = lVar3 + -1;
        bVar2 = 7 < uVar6;
        uVar6 = uVar5;
      } while (bVar2);
    } while (uVar7 != 0);
    break;
  case 6:
    anon_unknown_53::IntDigits::PrintAsHexLower<absl::lts_20240722::uint128>
              ((IntDigits *)local_68,v);
    goto LAB_0010a3aa;
  case 7:
    lVar3 = 0;
    do {
      do {
        uVar8 = (uint)uVar7;
        uVar7 = uVar7 >> 4 | uVar6 << 0x3c;
        local_68[lVar3 + 0x3b] = "0123456789ABCDEF"[uVar8 & 0xf];
        uVar5 = uVar6 >> 4;
        lVar3 = lVar3 + -1;
        bVar2 = 0xf < uVar6;
        uVar6 = uVar5;
      } while (bVar2);
    } while (uVar7 != 0);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    auVar10._8_4_ = v.lo_._4_4_;
    auVar10._0_8_ = uVar7;
    auVar10._12_4_ = 0x45300000;
    dStack_20 = auVar10._8_8_ - 1.9342813113834067e+25;
    local_28 = dStack_20 + ((double)CONCAT44(0x43300000,(int)v.lo_) - 4503599627370496.0);
    auVar11._8_4_ = v.hi_._4_4_;
    auVar11._0_8_ = uVar6;
    auVar11._12_4_ = 0x45300000;
    dVar9 = ldexp((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)v.hi_) - 4503599627370496.0),0x40);
    bVar2 = ConvertFloatImpl(dVar9 + local_28,&local_78,sink);
    return bVar2;
  }
  local_68._0_8_ = local_68 + lVar3 + 0x3c;
  local_68._8_8_ = -lVar3;
LAB_0010a3aa:
  if (((undefined1  [12])conv & (undefined1  [12])0xff00) == (undefined1  [12])0x0) {
    v_01._M_str = (char *)local_68._0_8_;
    v_01._M_len = local_68._8_8_;
    FormatSinkImpl::Append(sink,v_01);
  }
  else {
    conv_01.precision_ = v_00;
    conv_01.conv_ = local_68[8];
    conv_01.flags_ = local_68[9];
    conv_01.length_mod_ = local_68[10];
    conv_01._3_1_ = local_68[0xb];
    conv_01.width_ = local_68._12_4_;
    anon_unknown_53::ConvertIntImplInnerSlow
              ((IntDigits *)local_68._0_8_,conv_01,(FormatSinkImpl *)(ulong)uVar4);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}